

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O3

bool __thiscall Merlin::read_dataset(Merlin *this,string *dataset)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pcVar3;
  undefined4 uVar4;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  long lVar7;
  runtime_error *this_00;
  ulong uVar8;
  char cVar9;
  pointer pbVar10;
  pointer this_01;
  ulong uVar11;
  pointer pbVar12;
  string err_msg;
  vector<double,_std::allocator<double>_> likelihood;
  string token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string line;
  vector<merlin::observation,_std::allocator<merlin::observation>_> example;
  string str;
  istringstream in;
  undefined1 local_2c8 [18];
  undefined6 uStack_2b6;
  undefined2 uStack_2b0;
  undefined6 uStack_2ae;
  undefined2 uStack_2a8;
  Merlin *local_2a0;
  vector<double,_std::allocator<double>_> local_298;
  char *local_278 [2];
  char local_268 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_210;
  ulong local_1f0;
  vector<merlin::observation,_std::allocator<merlin::observation>_> local_1e8;
  undefined1 local_1d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [2];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_2a0 = this;
  std::__cxx11::istringstream::istringstream
            ((istringstream *)local_1b0[0]._M_local_buf,(string *)dataset,_S_in);
  if ((abStack_190[*(long *)(local_1b0[0]._M_allocated_capacity - 0x18)] & 5) != 0) {
    local_2c8._0_8_ = local_2c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,"Cannot open the training dataset string","");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(string *)local_2c8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar1 = (local_2a0->m_dataset).
           super__Vector_base<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (local_2a0->m_dataset).
           super__Vector_base<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pvVar1;
  if (pvVar2 != pvVar1) {
    do {
      std::vector<merlin::observation,_std::allocator<merlin::observation>_>::~vector(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pvVar2);
    (local_2a0->m_dataset).
    super__Vector_base<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  }
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  local_2c8._16_2_ = 0;
  uStack_2b6 = 0;
  pvVar6 = merlin::split(dataset,'|',
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_228,pvVar6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2c8);
  if (local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2a0 = (Merlin *)&local_2a0->m_dataset;
    uVar8 = 0;
    do {
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      pcVar3 = local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar3,
                 pcVar3 + local_228.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length);
      if (local_210._M_string_length != 0) {
        local_2c8._0_8_ = (pointer)0x0;
        local_2c8._8_8_ = (pointer)0x0;
        local_2c8._16_2_ = 0;
        uStack_2b6 = 0;
        local_1f0 = uVar8;
        pvVar6 = merlin::split(&local_210,',',
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_240,pvVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2c8);
        local_1e8.super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_240.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_240.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar8 = 0;
          do {
            local_278[0] = local_268;
            pcVar3 = local_240.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,pcVar3,
                       pcVar3 + local_240.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length);
            iVar5 = std::__cxx11::string::compare((char *)local_278);
            uVar4 = (undefined4)uVar8;
            if (iVar5 == 0) {
              local_2c8._4_4_ = 0xffffffff;
              local_2c8._0_4_ = uVar4;
              uStack_2b0 = 0;
              uStack_2ae = 0;
              uStack_2a8._0_1_ = false;
              uStack_2a8._1_1_ = false;
              local_2c8._8_8_ = (pointer)0x0;
              local_2c8._16_2_ = 0;
              uStack_2b6 = 0;
              std::vector<merlin::observation,_std::allocator<merlin::observation>_>::
              emplace_back<merlin::observation>(&local_1e8,(observation *)local_2c8);
LAB_0015ca28:
              pbVar10 = (pointer)local_2c8._8_8_;
              if ((pointer)local_2c8._8_8_ != (pointer)0x0) {
LAB_0015ca32:
                operator_delete(pbVar10);
              }
            }
            else {
              lVar7 = std::__cxx11::string::find((char *)local_278,0x177302,0);
              if (lVar7 == -1) {
                iVar5 = atoi(local_278[0]);
                local_2c8._0_8_ = CONCAT44(iVar5,uVar4);
                local_2c8._8_8_ = (pointer)0x0;
                local_2c8._16_2_ = 0;
                uStack_2b6 = 0;
                uStack_2b0 = 0;
                uStack_2ae = 0;
                uStack_2a8._0_1_ = true;
                uStack_2a8._1_1_ = false;
                std::vector<merlin::observation,_std::allocator<merlin::observation>_>::
                emplace_back<merlin::observation>(&local_1e8,(observation *)local_2c8);
                goto LAB_0015ca28;
              }
              cVar9 = (char)(string *)local_278;
              std::__cxx11::string::find(cVar9,0x5b);
              std::__cxx11::string::find(cVar9,0x5d);
              std::__cxx11::string::substr((ulong)local_1d0,(ulong)local_278);
              local_2c8._0_8_ = (pointer)0x0;
              local_2c8._8_8_ = (pointer)0x0;
              local_2c8._16_2_ = 0;
              uStack_2b6 = 0;
              pvVar6 = merlin::split((string *)local_1d0,';',
                                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_2c8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_258,pvVar6);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2c8);
              local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (double *)0x0;
              local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (double *)0x0;
              if (local_258.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_258.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                lVar7 = 0;
                uVar11 = 0;
                pbVar10 = local_258.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pbVar12 = local_258.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  local_2c8._0_8_ = atof(*(char **)((long)&(pbVar12->_M_dataplus)._M_p + lVar7));
                  if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              ((vector<double,std::allocator<double>> *)&local_298,
                               (iterator)
                               local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(double *)local_2c8);
                    pbVar10 = local_258.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    pbVar12 = local_258.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  else {
                    *local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = (double)local_2c8._0_8_;
                    local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  uVar11 = uVar11 + 1;
                  lVar7 = lVar7 + 0x20;
                } while (uVar11 < (ulong)((long)pbVar10 - (long)pbVar12 >> 5));
              }
              local_2c8._4_4_ = 0xffffffff;
              local_2c8._0_4_ = uVar4;
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)(local_2c8 + 8),&local_298);
              uStack_2a8._0_1_ = false;
              uStack_2a8._1_1_ = true;
              std::vector<merlin::observation,_std::allocator<merlin::observation>_>::
              emplace_back<merlin::observation>(&local_1e8,(observation *)local_2c8);
              if ((pointer)local_2c8._8_8_ != (pointer)0x0) {
                operator_delete((void *)local_2c8._8_8_);
              }
              if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_298.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_258);
              pbVar10 = (pointer)local_1d0._0_8_;
              if ((pointer)local_1d0._0_8_ != (pointer)(local_1d0 + 0x10)) goto LAB_0015ca32;
            }
            if (local_278[0] != local_268) {
              operator_delete(local_278[0]);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (ulong)((long)local_240.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_240.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::
        vector<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
        ::push_back((vector<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
                     *)local_2a0,&local_1e8);
        std::vector<merlin::observation,_std::allocator<merlin::observation>_>::~vector(&local_1e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_240);
        uVar8 = local_1f0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_228.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_228.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0[0]._M_local_buf);
  std::ios_base::~ios_base(local_138);
  return true;
}

Assistant:

bool Merlin::read_dataset(std::string dataset) {
	try {

		// Open the evidence file
		std::istringstream in(dataset);
		if (in.fail()) {
			std::string err_msg("Cannot open the training dataset string");
			throw std::runtime_error(err_msg);
		}

		// Clear any previous training dataset
		m_dataset.clear();

		// Read the training dataset string line by line
		std::vector<std::string> lines = merlin::split(dataset, '|');
		for (size_t l = 0; l < lines.size(); ++l) {
			std::string line = lines[l];
			if (line.empty()) continue; // skip empty lines
			std::vector<std::string> tokens = merlin::split(line, ',');
			std::vector<merlin::observation> example;
			for (size_t i = 0; i < tokens.size(); ++i) {
				std::string token = tokens[i];
				if (token.compare("?") == 0) { // missing value
					example.push_back(merlin::observation(i));
				} else if (token.find("[") != token.npos) { // likelihood evidence
					size_t first = token.find('[');
					size_t last = token.find(']');
					std::string str = token.substr(first+1, last-first-1);
					std::vector<std::string> temp = merlin::split(str, ';');
					std::vector<double> likelihood;
					for (size_t k = 0; k < temp.size(); ++k) {
						double d = std::atof(temp[k].c_str());
						likelihood.push_back(d);
					}
					example.push_back(merlin::observation(i, likelihood));
				} else { // regular value
					int val = std::atoi(token.c_str());
					example.push_back(merlin::observation(i, val));
				}
			}

			m_dataset.push_back(example);
		}

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}